

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicSSOCase2::Cleanup(BasicSSOCase2 *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program_ab);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program_c);
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_pipeline);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vao);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteProgram(m_program_ab);
		glDeleteProgram(m_program_c);
		glDeleteProgramPipelines(1, &m_pipeline);
		glDeleteBuffers(1, &m_storage_buffer);
		glDeleteVertexArrays(1, &m_vao);
		return NO_ERROR;
	}